

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

uint32_t add_constant(Vm *vm,CrispyValue value)

{
  CallFrame *pCVar1;
  
  pCVar1 = (vm->frames).frame_pointers[vm->frame_count - 1];
  if ((pCVar1->constants).count < 0xffff) {
    write_value(&pCVar1->constants,value);
    return (int)(pCVar1->constants).count - 1;
  }
  fwrite("Too many constants.\n",0x14,1,_stderr);
  exit(0x2d);
}

Assistant:

uint32_t add_constant(Vm *vm, CrispyValue value) {
    CallFrame *call_frame = CURR_FRAME(vm);
    if (call_frame->constants.count >= UINT16_MAX) {
        fprintf(stderr, "Too many constants.\n");
        exit(45);
    }

    write_value(&call_frame->constants, value);
    return (uint32_t) (call_frame->constants.count - 1);
}